

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCEncoder.cpp
# Opt level: O3

bool __thiscall gnilk::IPCBinaryEncoder::BeginArray(IPCBinaryEncoder *this,uint16_t num)

{
  undefined1 local_4 [4];
  
  (*(code *)**(undefined8 **)this)(this,local_4,4);
  return true;
}

Assistant:

bool IPCBinaryEncoder::BeginArray(uint16_t num) {
    IPCArrayHeader arrayHeader;
    arrayHeader.headerVersion = kMsgVer_Current;
    arrayHeader.reserved = 0;
    arrayHeader.num = num;
    Write(&arrayHeader, sizeof(arrayHeader));
    return true;
}